

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

void __thiscall asmjit::v1_14::BaseEmitter::onSettingsUpdated(BaseEmitter *this)

{
  CodeHolder *pCVar1;
  undefined1 uVar2;
  
  pCVar1 = this->_code;
  if (pCVar1 == (CodeHolder *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/emitter.cpp"
               ,0x194,"_code != nullptr");
  }
  if ((this->_emitterFlags & kOwnLogger) == kNone) {
    this->_logger = pCVar1->_logger;
  }
  if ((this->_emitterFlags & kOwnErrorHandler) == kNone) {
    this->_errorHandler = pCVar1->_errorHandler;
    BaseEmitter_updateForcedOptions(this);
    return;
  }
  if (this->_emitterType == kAssembler) {
    if (this->_code == (CodeHolder *)0x0) {
LAB_001179d6:
      this->_emitterFlags = this->_emitterFlags & ~kLogComments;
      goto LAB_001179da;
    }
    uVar2 = (char)this->_diagnosticOptions & kValidateAssembler;
    if (this->_logger != (Logger *)0x0) goto LAB_001179c2;
    this->_emitterFlags = this->_emitterFlags & ~kLogComments;
  }
  else {
    if (this->_code == (CodeHolder *)0x0) goto LAB_001179d6;
    uVar2 = (byte)((char)this->_diagnosticOptions & kValidateIntermediate) >> 1;
LAB_001179c2:
    this->_emitterFlags = this->_emitterFlags | kLogComments;
  }
  if ((uVar2 == kNone) && (this->_logger == (Logger *)0x0)) {
    *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions & 0xfe;
    return;
  }
LAB_001179da:
  *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions | kReserved;
  return;
}

Assistant:

void BaseEmitter::onSettingsUpdated() noexcept {
  // Only called when attached to CodeHolder by CodeHolder.
  ASMJIT_ASSERT(_code != nullptr);

  if (!hasOwnLogger())
    _logger = _code->logger();

  if (!hasOwnErrorHandler())
    _errorHandler = _code->errorHandler();

  BaseEmitter_updateForcedOptions(this);
}